

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hh
# Opt level: O2

void __thiscall
tchecker::
join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
::advance_while_empty_range
          (join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
           *this)

{
  uint *puVar1;
  range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>
  rVar2;
  
  puVar1 = (this->_it).super_type.m_iterator;
  do {
    if (puVar1 == (this->_end).super_type.m_iterator) {
LAB_00188bb1:
      (this->_range_it).super_const_iterator._M_current =
           (shared_ptr<const_tchecker::system::edge_t> *)0x0;
      (this->_range_end).super_const_iterator._M_current =
           (shared_ptr<const_tchecker::system::edge_t> *)0x0;
      return;
    }
    rVar2 = std::
            function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(const_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_&)>
            ::operator()(&this->_get_sub_range,&this->_it);
    this->_range_it = (begin_iterator_t)rVar2._begin.super_const_iterator._M_current;
    this->_range_end = (end_iterator_t)rVar2._end.super_const_iterator._M_current;
    puVar1 = (this->_it).super_type.m_iterator;
    if ((shared_ptr<const_tchecker::system::edge_t> *)rVar2._begin.super_const_iterator._M_current
        != rVar2._end.super_const_iterator._M_current.super_const_iterator) {
      if (puVar1 != (this->_end).super_type.m_iterator) {
        return;
      }
      goto LAB_00188bb1;
    }
    puVar1 = puVar1 + 1;
    (this->_it).super_type.m_iterator = puVar1;
  } while( true );
}

Assistant:

void advance_while_empty_range()
  {
    // Find first non-empty range, if any
    while (_it != _end) {
      std::tie(_range_it, _range_end) = _get_sub_range(_it).iterators();
      if (_range_it != _range_end)
        break;
      ++_it;
    }
    if (_it == _end) {
      _range_it = typename SUBR::begin_iterator_t{};
      _range_end = typename SUBR::end_iterator_t{};
    }
  }